

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int memParseTest(char *filename,char *result,char *err,int options)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  int iVar3;
  int size;
  char *base;
  int local_3c;
  char *local_38;
  
  nb_tests = nb_tests + 1;
  iVar1 = loadMem(filename,&local_38,&local_3c);
  if (iVar1 == 0) {
    ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
    __ptr = local_38;
    doc = (xmlDocPtr)xmlCtxtReadMemory(ctxt,local_38,local_3c,filename,0,options | 0x40);
    free(__ptr);
    if (doc == (xmlDocPtr)0x0) {
      iVar1 = 1;
    }
    else {
      xmlDocDumpMemory(doc,&local_38,&local_3c);
      iVar1 = compareFileMem(result,local_38,local_3c);
      iVar3 = 0;
      if ((local_38 == (char *)0x0) || (iVar1 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
        iVar3 = -1;
      }
      iVar2 = testParseContent(ctxt,doc,filename);
      iVar1 = -1;
      if (-1 < iVar2) {
        iVar1 = iVar3;
      }
      xmlFreeDoc(doc);
      xmlFreeParserCtxt(ctxt);
      (*_xmlFree)(local_38);
    }
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",filename);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
memParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    const char *base;
    int size, res;
    int ret = 0;

    options |= XML_PARSE_NOWARNING;

    nb_tests++;
    /*
     * load and parse the memory
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    ctxt = xmlNewParserCtxt();
    doc = xmlCtxtReadMemory(ctxt, base, size, filename, NULL, options);
    unloadMem(base);
    if (doc == NULL) {
        return(1);
    }
    xmlDocDumpMemory(doc, (xmlChar **) &base, &size);
    res = compareFileMem(result, base, size);
    if ((base == NULL) || (res != 0)) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	ret = -1;
    }

    if (testParseContent(ctxt, doc, filename) < 0)
	ret = -1;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    xmlFree((char *)base);
    return(ret);
}